

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::setupRender
          (BBoxRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  TypedObjectWrapper<(glu::ObjectType)3> *pTVar2;
  code *pcVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 local_1b0 [384];
  long lVar10;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  iVar5 = (**(code **)(lVar10 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  iVar6 = (**(code **)(lVar10 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_color");
  iVar7 = (**(code **)(lVar10 + 0xb48))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program);
  if (iVar5 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0x34c);
  }
  else if (iVar6 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0x34d);
  }
  else {
    if (iVar7 != -1) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Setting viewport to (",0x15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x: ",3);
      std::ostream::operator<<(poVar1,(config->viewportPos).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"y: ",3);
      std::ostream::operator<<(poVar1,(config->viewportPos).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"w: ",3);
      std::ostream::operator<<(poVar1,(config->viewportSize).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"h: ",3);
      std::ostream::operator<<(poVar1,(config->viewportSize).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Vertex coordinates are in range:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
      std::ostream::_M_insert<double>((double)(config->patternPos).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>
                ((double)((config->patternPos).m_data[0] + (config->patternSize).m_data[0]));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
      std::ostream::_M_insert<double>((double)(config->patternPos).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>
                ((double)((config->patternPos).m_data[1] + (config->patternSize).m_data[1]));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if (this->m_calcPerPrimitiveBBox == false) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Setting primitive bounding box to:\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        tcu::operator<<((ostream *)poVar1,&(config->bbox).min);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        tcu::operator<<((ostream *)poVar1,&(config->bbox).max);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      }
      if (this->m_useGlobalState == true) {
        fVar11 = (config->bbox).min.m_data[1];
        fVar12 = (config->bbox).min.m_data[2];
        fVar13 = (config->bbox).min.m_data[3];
        fVar14 = (config->bbox).max.m_data[0];
        fVar15 = (config->bbox).max.m_data[1];
        fVar16 = (config->bbox).max.m_data[2];
        fVar17 = (config->bbox).max.m_data[3];
        fVar4 = (config->bbox).min.m_data[0];
      }
      else {
        fVar11 = -2.0;
        fVar14 = -1.7;
        fVar13 = 1.0;
        fVar12 = 0.0;
        fVar16 = 0.0;
        fVar15 = -1.7;
        fVar17 = 1.0;
        fVar4 = fVar11;
      }
      (**(code **)(lVar10 + 0x1040))(fVar4,fVar11,fVar12,fVar13,fVar14,fVar15,fVar16,fVar17);
      pTVar2 = (this->m_fbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               .m_data.ptr;
      if (pTVar2 != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
        (**(code **)(lVar10 + 0x78))(0x8ca9,(pTVar2->super_ObjectWrapper).m_object);
      }
      (**(code **)(lVar10 + 0x1a00))
                ((config->viewportPos).m_data[0],(config->viewportPos).m_data[1],
                 (config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
      (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar10 + 0x188))(0x4000);
      (**(code **)(lVar10 + 0x40))
                (0x8892,(((this->m_vbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                          .m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar10 + 0x19f0))(iVar5,4,0x1406,0,0x20,0);
      (**(code **)(lVar10 + 0x19f0))(iVar6,4,0x1406,0,0x20,0x10);
      (**(code **)(lVar10 + 0x610))(iVar5);
      (**(code **)(lVar10 + 0x610))(iVar6);
      (**(code **)(lVar10 + 0x1680))
                ((((this->m_program).
                   super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                   m_data.ptr)->m_program).m_program);
      (**(code **)(lVar10 + 0x15a0))
                ((config->patternPos).m_data[0],(config->patternPos).m_data[1],
                 (config->patternSize).m_data[0],(config->patternSize).m_data[1],iVar7);
      uVar8 = (**(code **)(lVar10 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_primitiveBBoxMin");
      uVar9 = (**(code **)(lVar10 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_primitiveBBoxMax");
      (**(code **)(lVar10 + 0x15a0))
                ((config->bbox).min.m_data[0],(config->bbox).min.m_data[1],
                 (config->bbox).min.m_data[2],(config->bbox).min.m_data[3],uVar8);
      (**(code **)(lVar10 + 0x15a0))
                ((config->bbox).max.m_data[0],(config->bbox).max.m_data[1],
                 (config->bbox).max.m_data[2],(config->bbox).max.m_data[3],uVar9);
      pcVar3 = *(code **)(lVar10 + 0x1530);
      uVar8 = (**(code **)(lVar10 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_viewportPos");
      (*pcVar3)(uVar8,(config->viewportPos).m_data[0],(config->viewportPos).m_data[1]);
      pcVar3 = *(code **)(lVar10 + 0x1530);
      uVar8 = (**(code **)(lVar10 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_viewportSize");
      (*pcVar3)(uVar8,(config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
      err = (**(code **)(lVar10 + 0x800))();
      glu::checkError(err,"setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x386);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posScaleLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0x34e);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BBoxRenderCase::setupRender (const IterationConfig& config)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLint		posLocation			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glw::GLint		colLocation			= gl.getAttribLocation(m_program->getProgram(), "a_color");
	const glw::GLint		posScaleLocation	= gl.getUniformLocation(m_program->getProgram(), "u_posScale");

	TCU_CHECK(posLocation != -1);
	TCU_CHECK(colLocation != -1);
	TCU_CHECK(posScaleLocation != -1);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting viewport to ("
			<< "x: " << config.viewportPos.x() << ", "
			<< "y: " << config.viewportPos.y() << ", "
			<< "w: " << config.viewportSize.x() << ", "
			<< "h: " << config.viewportSize.y() << ")\n"
		<< "Vertex coordinates are in range:\n"
			<< "\tx: [" << config.patternPos.x() << ", " << (config.patternPos.x() + config.patternSize.x()) << "]\n"
			<< "\ty: [" << config.patternPos.y() << ", " << (config.patternPos.y() + config.patternSize.y()) << "]\n"
		<< tcu::TestLog::EndMessage;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Setting primitive bounding box to:\n"
				<< "\t" << config.bbox.min << "\n"
				<< "\t" << config.bbox.max << "\n"
			<< tcu::TestLog::EndMessage;

	if (m_useGlobalState)
		gl.primitiveBoundingBox(config.bbox.min.x(), config.bbox.min.y(), config.bbox.min.z(), config.bbox.min.w(),
								config.bbox.max.x(), config.bbox.max.y(), config.bbox.max.z(), config.bbox.max.w());
	else
		// state is overriden by the tessellation output, set bbox to invisible area to imitiate dirty state left by application
		gl.primitiveBoundingBox(-2.0f, -2.0f, 0.0f, 1.0f,
								-1.7f, -1.7f, 0.0f, 1.0f);

	if (m_fbo)
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);

	gl.viewport(config.viewportPos.x(), config.viewportPos.y(), config.viewportSize.x(), config.viewportSize.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, (int)(VA_NUM_ATTRIB_VECS * sizeof(float[4])), (const float*)DE_NULL + 4 * VA_POS_VEC_NDX);
	gl.vertexAttribPointer(colLocation, 4, GL_FLOAT, GL_FALSE, (int)(VA_NUM_ATTRIB_VECS * sizeof(float[4])), (const float*)DE_NULL + 4 * VA_COL_VEC_NDX);
	gl.enableVertexAttribArray(posLocation);
	gl.enableVertexAttribArray(colLocation);
	gl.useProgram(m_program->getProgram());
	gl.uniform4f(posScaleLocation, config.patternPos.x(), config.patternPos.y(), config.patternSize.x(), config.patternSize.y());

	{
		const glw::GLint bboxMinPos = gl.getUniformLocation(m_program->getProgram(), "u_primitiveBBoxMin");
		const glw::GLint bboxMaxPos = gl.getUniformLocation(m_program->getProgram(), "u_primitiveBBoxMax");

		gl.uniform4f(bboxMinPos, config.bbox.min.x(), config.bbox.min.y(), config.bbox.min.z(), config.bbox.min.w());
		gl.uniform4f(bboxMaxPos, config.bbox.max.x(), config.bbox.max.y(), config.bbox.max.z(), config.bbox.max.w());
	}

	gl.uniform2i(gl.getUniformLocation(m_program->getProgram(), "u_viewportPos"), config.viewportPos.x(), config.viewportPos.y());
	gl.uniform2i(gl.getUniformLocation(m_program->getProgram(), "u_viewportSize"), config.viewportSize.x(), config.viewportSize.y());

	GLU_EXPECT_NO_ERROR(gl.getError(), "setup");
}